

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode connect_init(Curl_easy *data,_Bool reinit)

{
  connectdata *conn;
  bool bVar1;
  CURLcode CVar2;
  CURLcode extraout_EAX;
  http_connect_state *unaff_RBX;
  
  conn = data->conn;
  if ((conn->handler->flags & 0x4000) == 0) {
    if (reinit) {
      unaff_RBX = conn->connect_state;
      Curl_dyn_reset(&unaff_RBX->rcvbuf);
    }
    else {
      CVar2 = Curl_get_upload_buffer(data);
      if (CVar2 == CURLE_OK) {
        unaff_RBX = (http_connect_state *)(*Curl_ccalloc)(1,0x358);
        if (unaff_RBX == (http_connect_state *)0x0) {
          CVar2 = CURLE_OUT_OF_MEMORY;
          unaff_RBX = (http_connect_state *)0x0;
          bVar1 = false;
        }
        else {
          Curl_infof(data,"allocate connect buffer");
          conn->connect_state = unaff_RBX;
          Curl_dyn_init(&unaff_RBX->rcvbuf,0x4000);
          unaff_RBX->prot_save = (HTTP *)(data->req).p;
          (data->req).p.rtsp = (RTSP *)unaff_RBX;
          Curl_conncontrol(conn,0);
          bVar1 = true;
          CVar2 = extraout_EAX;
        }
      }
      else {
        bVar1 = false;
      }
      if (!bVar1) {
        return CVar2;
      }
    }
    unaff_RBX->tunnel_state = TUNNEL_INIT;
    unaff_RBX->keepon = KEEPON_CONNECT;
    unaff_RBX->cl = 0;
    unaff_RBX->field_0x354 = unaff_RBX->field_0x354 & 0xfd;
    CVar2 = CURLE_OK;
  }
  else {
    Curl_failf(data,"%s cannot be done over CONNECT",conn->handler->scheme);
    CVar2 = CURLE_UNSUPPORTED_PROTOCOL;
  }
  return CVar2;
}

Assistant:

static CURLcode connect_init(struct Curl_easy *data, bool reinit)
{
  struct http_connect_state *s;
  struct connectdata *conn = data->conn;
  if(conn->handler->flags & PROTOPT_NOTCPPROXY) {
    failf(data, "%s cannot be done over CONNECT", conn->handler->scheme);
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  if(!reinit) {
    CURLcode result;
    DEBUGASSERT(!conn->connect_state);
    /* we might need the upload buffer for streaming a partial request */
    result = Curl_get_upload_buffer(data);
    if(result)
      return result;

    s = calloc(1, sizeof(struct http_connect_state));
    if(!s)
      return CURLE_OUT_OF_MEMORY;
    infof(data, "allocate connect buffer");
    conn->connect_state = s;
    Curl_dyn_init(&s->rcvbuf, DYN_PROXY_CONNECT_HEADERS);

    /* Curl_proxyCONNECT is based on a pointer to a struct HTTP at the
     * member conn->proto.http; we want [protocol] through HTTP and we have
     * to change the member temporarily for connecting to the HTTP
     * proxy. After Curl_proxyCONNECT we have to set back the member to the
     * original pointer
     *
     * This function might be called several times in the multi interface case
     * if the proxy's CONNECT response is not instant.
     */
    s->prot_save = data->req.p.http;
    data->req.p.http = &s->http_proxy;
    connkeep(conn, "HTTP proxy CONNECT");
  }
  else {
    DEBUGASSERT(conn->connect_state);
    s = conn->connect_state;
    Curl_dyn_reset(&s->rcvbuf);
  }
  s->tunnel_state = TUNNEL_INIT;
  s->keepon = KEEPON_CONNECT;
  s->cl = 0;
  s->close_connection = FALSE;
  return CURLE_OK;
}